

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psocks.c
# Opt level: O2

void psocks_connection_establish(void *vctx)

{
  SockAddr *addr;
  char *pcVar1;
  _STACK *p_Var2;
  
  addr = sk_namelookup(*(char **)((long)vctx + 0x10),(char **)((long)vctx + 0x18),0);
  *(SockAddr **)((long)vctx + 0x28) = addr;
  pcVar1 = sk_addr_error(addr);
  if (pcVar1 != (char *)0x0) {
    pcVar1 = dupprintf("name lookup failed: %s",pcVar1);
    (**(code **)(**(long **)((long)vctx + 8) + 0x10))(*(long **)((long)vctx + 8),pcVar1);
    safefree(pcVar1);
    psocks_conn_free((psocks_connection *)vctx);
    return;
  }
  *(undefined1 *)((long)vctx + 0x38) = 1;
  p_Var2 = sk_new(*(cmp **)((long)vctx + 0x28));
  *(_STACK **)((long)vctx + 0x30) = p_Var2;
  return;
}

Assistant:

static void psocks_connection_establish(void *vctx)
{
    psocks_connection *conn = (psocks_connection *)vctx;

    /*
     * Look up destination host name.
     */
    conn->addr = sk_namelookup(conn->host, &conn->realhost, ADDRTYPE_UNSPEC);

    const char *err = sk_addr_error(conn->addr);
    if (err) {
        char *msg = dupprintf("name lookup failed: %s", err);
        chan_open_failed(conn->chan, msg);
        sfree(msg);

        psocks_conn_free(conn);
        return;
    }

    /*
     * Make the connection.
     */
    conn->connecting = true;
    conn->socket = sk_new(conn->addr, conn->port, false, false, false, false,
                          &conn->plug);
}